

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<char,_ft::allocator<char>_>::~deque(deque<char,_ft::allocator<char>_> *this)

{
  pointer p;
  bool bVar1;
  size_type sVar2;
  ulong local_48;
  size_type i;
  iterator it;
  chunk_allocator chunk_alloc;
  deque<char,_ft::allocator<char>_> *this_local;
  
  allocator<char_*>::allocator((allocator<char_*> *)((long)&it.m_node + 7));
  dequeIterator<char,_64UL>::dequeIterator((dequeIterator<char,_64UL> *)&i,&this->m_start);
  while( true ) {
    bVar1 = operator!=((dequeIterator<char,_64UL> *)&i,&this->m_finish);
    if (!bVar1) break;
    allocator<char>::destroy((allocator<char> *)&this->field_0x70,(pointer)it._vptr_dequeIterator);
    dequeIterator<char,_64UL>::operator++((dequeIterator<char,_64UL> *)&i);
  }
  dequeIterator<char,_64UL>::~dequeIterator((dequeIterator<char,_64UL> *)&i);
  for (local_48 = 0; local_48 < this->m_map_size; local_48 = local_48 + 1) {
    allocator<char_*>::destroy((allocator<char_*> *)((long)&it.m_node + 7),this->m_map + local_48);
    p = this->m_map[local_48];
    sVar2 = chunk_size(this);
    allocator<char>::deallocate((allocator<char> *)&this->field_0x70,p,sVar2);
  }
  allocator<char_*>::deallocate
            ((allocator<char_*> *)((long)&it.m_node + 7),this->m_map,this->m_map_size);
  allocator<char_*>::~allocator((allocator<char_*> *)((long)&it.m_node + 7));
  allocator<char>::~allocator((allocator<char> *)&this->field_0x70);
  dequeIterator<char,_64UL>::~dequeIterator(&this->m_finish);
  dequeIterator<char,_64UL>::~dequeIterator(&this->m_start);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}